

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_avx2.c
# Opt level: O1

void aom_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  uint uVar38;
  long lVar39;
  int iVar40;
  uint uVar41;
  uint16_t uVar42;
  short *psVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  
  auVar2 = vpmovzxwd_avx(ZEXT416(*(uint *)dequant_ptr));
  auVar2 = vpmaddwd_avx(auVar2,_DAT_00514960);
  auVar47._8_4_ = 0x40;
  auVar47._0_8_ = 0x4000000040;
  auVar47._12_4_ = 0x40;
  auVar2 = vpaddd_avx(auVar2,auVar47);
  auVar47 = vpsrad_avx(auVar2,7);
  auVar2 = vpmovsxwd_avx(ZEXT416(*(uint *)zbin_ptr));
  auVar49 = vpslld_avx(auVar2,5);
  auVar2 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
  auVar2 = vpaddd_avx(auVar49,auVar2);
  auVar2 = vpaddd_avx(auVar2,auVar47);
  auVar47 = vpshufd_avx(auVar2,0x55);
  auVar48._0_8_ = auVar47._0_8_;
  auVar48._8_8_ = auVar48._0_8_;
  auVar48._16_8_ = auVar48._0_8_;
  auVar48._24_8_ = auVar48._0_8_;
  auVar58 = vpblendd_avx2(auVar48,ZEXT1632(auVar2),1);
  auVar55 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar4 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
  auVar3 = vpaddw_avx2(auVar55,auVar4);
  auVar55 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar4 = vpabsw_avx2(auVar55);
  auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar51 = vpunpcklwd_avx2(auVar4,auVar54);
  auVar52 = vpunpckhwd_avx2(auVar4,auVar54);
  auVar51 = vpslld_avx2(auVar51,5);
  auVar51 = vpcmpgtd_avx2(auVar51,auVar58);
  auVar52 = vpslld_avx2(auVar52,5);
  auVar52 = vpcmpgtd_avx2(auVar52,auVar48);
  auVar51 = vpackssdw_avx2(auVar51,auVar52);
  auVar52 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar35 = (auVar51 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar36 = (auVar51 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar51 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar51 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar51 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar51 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar51 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar51 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar51 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar51 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar51 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = (auVar51 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = SUB321(auVar51 >> 0x7f,0) != '\0';
  bVar20 = (auVar51 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar51 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar51 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar51 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar51 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar51 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = (auVar51 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = SUB321(auVar51 >> 0xbf,0) != '\0';
  bVar12 = (auVar51 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar51 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar51 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar51 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar51 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar51 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = (auVar51 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar46 = auVar51[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar35 || bVar36) || bVar34) || bVar33) || bVar32) || bVar31) ||
                              bVar30) || bVar29) || bVar28) || bVar27) || bVar26) || bVar25) ||
                        bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                 bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar10
          ) || bVar9) || bVar8) || bVar7) || bVar6) || bVar46) {
    auVar51 = vpermq_avx2(auVar51,0xd8);
    auVar52 = vpand_avx2(auVar51,*(undefined1 (*) [32])iscan);
  }
  bVar46 = ((((((((((((((((((((((((((((((bVar35 || bVar36) || bVar34) || bVar33) || bVar32) ||
                                    bVar31) || bVar30) || bVar29) || bVar28) || bVar27) || bVar26)
                              || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                        bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
                 bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar46;
  auVar58 = vpcmpgtw_avx2(auVar4,auVar3);
  auVar5 = vpermq_avx2(auVar58,0xd8);
  auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar36 = (auVar58 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar37 = (auVar58 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar35 = (auVar58 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar58 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar58 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar58 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar58 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar58 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar58 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar58 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar58 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar58 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = SUB321(auVar58 >> 0x7f,0) != '\0';
  bVar21 = (auVar58 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar58 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar58 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar58 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar58 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar58 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar58 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = SUB321(auVar58 >> 0xbf,0) != '\0';
  bVar13 = (auVar58 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar58 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar58 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar58 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar58 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar58 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar58 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = auVar58[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) || bVar32) ||
                              bVar31) || bVar30) || bVar29) || bVar28) || bVar27) || bVar26) ||
                        bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
                 bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11
          ) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) {
    auVar51 = vpand_avx2(auVar5,*(undefined1 (*) [32])iscan);
  }
  bVar6 = ((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) || bVar32
                                   ) || bVar31) || bVar30) || bVar29) || bVar28) || bVar27) ||
                             bVar26) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                       bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
                bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6;
  auVar59 = ZEXT1632(*(undefined1 (*) [16])round_ptr);
  auVar50 = ZEXT1632(*(undefined1 (*) [16])quant_ptr);
  auVar57 = ZEXT1632(*(undefined1 (*) [16])quant_shift_ptr);
  auVar56 = ZEXT1632(*(undefined1 (*) [16])dequant_ptr);
  auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar5 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar5 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar5 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar5 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar5 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar5 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar5 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar5 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar5 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar5 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar5 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar5 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar5 >> 0x7f,0) == '\0') &&
                    (auVar5 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar5 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar5 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar5 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar5 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar5 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar5 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar5 >> 0xbf,0) == '\0') &&
            (auVar5 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar5 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar5 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar5 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar5 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar5 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar5 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar5[0x1f]) {
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar53;
    *(undefined1 (*) [32])qcoeff_ptr = auVar53;
    auVar59 = vpermq_avx2(auVar59,0x55);
    auVar50 = vpermq_avx2(auVar50,0x55);
    auVar5 = vpermq_avx2(auVar57,0x55);
    auVar4 = vpermq_avx2(auVar56,0x55);
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar53;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar53;
  }
  else {
    auVar5 = vpermq_avx2(auVar59,0x54);
    auVar4 = vpaddsw_avx2(auVar5,auVar4);
    auVar5 = vpermq_avx2(auVar50,0x54);
    auVar5 = vpmulhw_avx2(auVar5,auVar4);
    auVar4 = vpaddw_avx2(auVar5,auVar4);
    auVar5 = vpermq_avx2(auVar57,0x54);
    auVar4 = vpmulhw_avx2(auVar5,auVar4);
    auVar59 = vpermq_avx2(auVar59,0x55);
    auVar50 = vpermq_avx2(auVar50,0x55);
    auVar5 = vpermq_avx2(auVar57,0x55);
    auVar4 = vpsignw_avx2(auVar4,auVar55);
    auVar4 = vpand_avx2(auVar58,auVar4);
    auVar55 = vpsraw_avx2(auVar4,0xf);
    auVar58 = vpunpcklwd_avx2(auVar4,auVar55);
    auVar55 = vpunpckhwd_avx2(auVar4,auVar55);
    *(undefined1 (*) [32])qcoeff_ptr = auVar58;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar55;
    auVar55 = vpermq_avx2(auVar56,0x54);
    auVar55 = vpmullw_avx2(auVar55,auVar4);
    auVar4 = vpermq_avx2(auVar56,0x55);
    auVar57 = vpsraw_avx2(auVar55,0xf);
    auVar58 = vpunpcklwd_avx2(auVar55,auVar57);
    auVar55 = vpunpckhwd_avx2(auVar55,auVar57);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar58;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar55;
  }
  auVar52 = vpmaxsw_avx2(auVar52,auVar54);
  auVar55 = vpmaxsw_avx2(auVar51,auVar53);
  if (0x10 < n_coeffs) {
    auVar51 = vpshufd_avx2(auVar3,0xee);
    lVar39 = 0x10;
    do {
      auVar58 = vpackssdw_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar39),
                               *(undefined1 (*) [32])(coeff_ptr + lVar39 + 8));
      auVar3 = vpabsw_avx2(auVar58);
      auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar54 = vpunpcklwd_avx2(auVar3,auVar53);
      auVar57 = vpunpckhwd_avx2(auVar3,auVar53);
      auVar54 = vpslld_avx2(auVar54,5);
      auVar54 = vpcmpgtd_avx2(auVar54,auVar48);
      auVar57 = vpslld_avx2(auVar57,5);
      auVar57 = vpcmpgtd_avx2(auVar57,auVar48);
      auVar54 = vpackssdw_avx2(auVar54,auVar57);
      auVar57 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar54 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar54 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar54 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar54 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar54 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar54 >> 0x2f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar54 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar54 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar54 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar54 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar54 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar54 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar54 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar54 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar54 >> 0x7f,0) != '\0') ||
                        (auVar54 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar54 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar54 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar54 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar54 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar54 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar54 >> 0xbf,0) != '\0') ||
                (auVar54 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar54 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar54 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar54 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar54 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar54 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar54 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          auVar54[0x1f] < '\0') {
        auVar54 = vpermq_avx2(auVar54,0xd8);
        auVar57 = vpand_avx2(auVar54,*(undefined1 (*) [32])(iscan + lVar39));
        bVar46 = true;
      }
      auVar54 = vpcmpgtw_avx2(auVar3,auVar51);
      auVar56 = vpermq_avx2(auVar54,0xd8);
      if ((((((((((((((((((((((((((((((((auVar54 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar54 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar54 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar54 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar54 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar54 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar54 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar54 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar54 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar54 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar54 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar54 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar54 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar54 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar54 >> 0x7f,0) == '\0') &&
                        (auVar54 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar54 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar54 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar54 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar54 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar54 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar54 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar54 >> 0xbf,0) == '\0') &&
                (auVar54 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar54 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar54 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar54 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar54 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar54 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar54 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar54[0x1f])
      {
        auVar60 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar60 = vpand_avx2(auVar56,*(undefined1 (*) [32])(iscan + lVar39));
        bVar6 = true;
      }
      if ((((((((((((((((((((((((((((((((auVar56 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar56 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar56 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar56 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar56 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar56 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar56 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar56 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar56 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar56 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar56 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar56 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar56 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0x7f,0) == '\0') &&
                        (auVar56 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar56 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar56 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar56 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar56 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar56 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar56 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar56 >> 0xbf,0) == '\0') &&
                (auVar56 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar56 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar56 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar56 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar56 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar56 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar56 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar56[0x1f])
      {
        *(undefined1 (*) [32])(qcoeff_ptr + lVar39 + 8) = auVar53;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar39) = auVar53;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar39 + 8) = auVar53;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar39) = auVar53;
      }
      else {
        auVar3 = vpaddsw_avx2(auVar3,auVar59);
        auVar53 = vpmulhw_avx2(auVar3,auVar50);
        auVar3 = vpaddw_avx2(auVar53,auVar3);
        auVar3 = vpmulhw_avx2(auVar3,auVar5);
        auVar3 = vpsignw_avx2(auVar3,auVar58);
        auVar3 = vpand_avx2(auVar54,auVar3);
        auVar58 = vpsraw_avx2(auVar3,0xf);
        auVar54 = vpunpcklwd_avx2(auVar3,auVar58);
        auVar58 = vpunpckhwd_avx2(auVar3,auVar58);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar39) = auVar54;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar39 + 8) = auVar58;
        auVar3 = vpmullw_avx2(auVar3,auVar4);
        auVar54 = vpsraw_avx2(auVar3,0xf);
        auVar58 = vpunpcklwd_avx2(auVar3,auVar54);
        auVar3 = vpunpckhwd_avx2(auVar3,auVar54);
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar39) = auVar58;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar39 + 8) = auVar3;
      }
      auVar52 = vpmaxsw_avx2(auVar57,auVar52);
      auVar55 = vpmaxsw_avx2(auVar60,auVar55);
      lVar39 = lVar39 + 0x10;
    } while (lVar39 < n_coeffs);
  }
  if (bVar46) {
    auVar2 = vpmaxsw_avx(auVar52._0_16_,auVar52._16_16_);
    auVar47 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar47,auVar2);
    auVar47 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar47,auVar2);
    auVar47 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar47);
    iVar40 = vpextrw_avx(auVar2,0);
    uVar41 = iVar40 + 1;
  }
  else {
    uVar41 = 0;
  }
  if (bVar6) {
    auVar2 = vpmaxsw_avx(auVar55._0_16_,auVar55._16_16_);
    auVar47 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmaxsw_avx(auVar47,auVar2);
    auVar47 = vpshufd_avx(auVar2,1);
    auVar2 = vpmaxsw_avx(auVar47,auVar2);
    auVar47 = vpsrld_avx(auVar2,0x10);
    auVar2 = vpmaxsw_avx(auVar2,auVar47);
    uVar38 = vpextrw_avx(auVar2,0);
  }
  else {
    uVar38 = 0xffffffff;
  }
  if ((int)uVar41 <= (int)uVar38) {
    iVar40 = uVar38 + 1;
    psVar43 = scan + uVar38;
    do {
      sVar1 = *psVar43;
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      iVar40 = iVar40 + -1;
      psVar43 = psVar43 + -1;
    } while ((int)uVar41 < iVar40);
  }
  uVar44 = 0xffffffff;
  uVar45 = (ulong)uVar41;
  do {
    iVar40 = (int)uVar44;
    if ((long)uVar45 < 1) break;
    lVar39 = uVar45 - 1;
    uVar45 = uVar45 - 1;
    if (qcoeff_ptr[scan[lVar39]] != 0) {
      uVar44 = uVar45 & 0xffffffff;
    }
    iVar40 = (int)uVar44;
  } while (qcoeff_ptr[scan[lVar39]] == 0);
  uVar42 = (uint16_t)(iVar40 + 1U);
  *eob_ptr = uVar42;
  if (uVar41 == 0) {
    uVar38 = 0xffffffff;
  }
  else {
    lVar39 = 0;
    do {
      uVar38 = (uint)lVar39;
      if (qcoeff_ptr[scan[lVar39]] != 0) break;
      bVar46 = (ulong)uVar41 - 1 != lVar39;
      lVar39 = lVar39 + 1;
      uVar38 = 0xffffffff;
    } while (bVar46);
  }
  if ((uVar42 != 0) && (uVar41 = (iVar40 + 1U & 0xffff) - 1, uVar38 == uVar41)) {
    sVar1 = scan[uVar41];
    if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
       (uVar41 = coeff_ptr[sVar1] >> 0x1f, uVar45 = (ulong)((uint)(sVar1 != 0) * 2),
       (int)((coeff_ptr[sVar1] << 5 ^ uVar41) - uVar41) <
       *(short *)((long)zbin_ptr + uVar45) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar45) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff, qcoeff;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                     dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff = load_coefficients_avx2(coeff_ptr);
  qcoeff = _mm256_abs_epi16(coeff);
  update_mask0_avx2(&qcoeff, threshold, iscan, &is_found0, &mask0);
  __m256i temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
  update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    // Reinsert signs
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    // Mask out zbin threshold coeffs
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff = load_coefficients_avx2(coeff_ptr + index);
    qcoeff = _mm256_abs_epi16(coeff);
    update_mask0_avx2(&qcoeff, threshold, iscan + index, &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
    cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
    update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr + index);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff0 = qcoeff_ptr[rc];
    if (qcoeff0) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff0 = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff0);
      const int abs_coeff = (coeff0 ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}